

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

HelpColumns * __thiscall Catch::Clara::Opt::getHelpColumns(Opt *this)

{
  bool bVar1;
  const_iterator this_00;
  ReusableStringStream *pRVar2;
  long in_RSI;
  HelpColumns *in_RDI;
  StringRef *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__range2;
  bool first;
  ReusableStringStream oss;
  ReusableStringStream *in_stack_ffffffffffffff78;
  ReusableStringStream *in_stack_ffffffffffffff80;
  StringRef *in_stack_ffffffffffffff88;
  HelpColumns *this_01;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  local_38;
  long local_30;
  byte local_21;
  
  this_01 = in_RDI;
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff80);
  local_21 = 1;
  local_30 = in_RSI + 0x40;
  local_38._M_current =
       (StringRef *)
       std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::begin
                 ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)
                  in_stack_ffffffffffffff78);
  this_00 = std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::end
                      ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)
                       in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
    ::operator*(&local_38);
    if ((local_21 & 1) == 0) {
      ReusableStringStream::operator<<
                (in_stack_ffffffffffffff80,(char (*) [3])in_stack_ffffffffffffff78);
    }
    else {
      local_21 = 0;
    }
    ReusableStringStream::operator<<((ReusableStringStream *)this_01,in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
    ::operator++(&local_38);
  }
  bVar1 = StringRef::empty((StringRef *)(in_RSI + 0x20));
  if (!bVar1) {
    pRVar2 = ReusableStringStream::operator<<
                       (in_stack_ffffffffffffff80,(char (*) [3])in_stack_ffffffffffffff78);
    pRVar2 = ReusableStringStream::operator<<((ReusableStringStream *)this_01,(StringRef *)pRVar2);
    ReusableStringStream::operator<<(pRVar2,(char *)in_stack_ffffffffffffff78);
  }
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff78);
  (this_01->descriptions).m_start = *(char **)(in_RSI + 0x30);
  (this_01->descriptions).m_size = *(size_type *)(in_RSI + 0x38);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)this_00._M_current);
  return in_RDI;
}

Assistant:

Detail::HelpColumns Opt::getHelpColumns() const {
            ReusableStringStream oss;
            bool first = true;
            for (auto const& opt : m_optNames) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if (!m_hint.empty())
                oss << " <" << m_hint << '>';
            return { oss.str(), m_description };
        }